

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void external_light_sensor_message_write_read_invoker(void)

{
  unit_test_log_t *puVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char local_8c9;
  basic_wrap_stringstream<char> local_8c8;
  basic_cstring<const_char> local_730;
  basic_cstring<const_char> local_720;
  char local_709;
  basic_wrap_stringstream<char> local_708;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  char local_549;
  basic_wrap_stringstream<char> local_548;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  char local_389;
  basic_wrap_stringstream<char> local_388;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  external_light_sensor_message_write_read local_1ce;
  char local_1cd [7];
  external_light_sensor_message_write_read t;
  basic_wrap_stringstream<char> local_1c0;
  basic_cstring<const_char> local_28;
  basic_cstring<const_char> local_18;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
             ,0x60);
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_1c0);
  local_1cd[0] = '\"';
  pbVar2 = boost::operator<<(pbVar2,local_1cd);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [41])"external_light_sensor_message_write_read");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_28,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_18,0xb8,&local_28);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
             ,0x60);
  memset(&local_388,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_388);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_388);
  local_389 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_389);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [41])"external_light_sensor_message_write_read");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [16])"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f0,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_1e0,0xb8,&local_1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_388);
  boost::unit_test::setup_conditional<external_light_sensor_message_write_read>(&local_1ce);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
             ,0x60);
  memset(&local_548,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_548);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_548);
  local_549 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_549);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [41])"external_light_sensor_message_write_read");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [13])"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3b0,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_3a0,0xb8,&local_3b0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_548);
  external_light_sensor_message_write_read::test_method(&local_1ce);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_560,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
             ,0x60);
  memset(&local_708,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_708);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_708);
  local_709 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_709);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [41])"external_light_sensor_message_write_read");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [19])"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_570,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_560,0xb8,&local_570);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_708);
  boost::unit_test::teardown_conditional<external_light_sensor_message_write_read>(&local_1ce);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_720,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
             ,0x60);
  memset(&local_8c8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_8c8);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_8c8);
  local_8c9 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_8c9);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [41])"external_light_sensor_message_write_read");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_730,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_720,0xb8,&local_730);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_8c8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_light_sensor_message_write_read)
{
    external_light_sensor_message write_msg;
    for(int i = 0; i<1; i++){
      write_msg.data[i] = static_cast<double>(i) + 0.6;
    }

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_light_sensor_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<1; i++){
      BOOST_TEST(read_msg.data[i] == write_msg.data[i]);
    }
}